

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall xatlas::internal::segment::Atlas::relocateSeed(Atlas *this,Chart *chart)

{
  uint uVar1;
  Chart *chart_00;
  uint32_t uVar2;
  uint *puVar3;
  uint *b;
  float cost_00;
  Vector3 VVar4;
  uint local_7c;
  uint32_t last;
  uint32_t i_1;
  float local_70;
  Vector3 local_68;
  float local_5c;
  float fStack_58;
  float distance;
  float local_50;
  undefined1 local_48 [8];
  Vector3 faceCentroid;
  float local_34;
  uint32_t face;
  float maxDistance;
  uint32_t leastCentral;
  float cost;
  uint32_t i;
  uint32_t faceCount;
  Chart *chart_local;
  Atlas *this_local;
  
  _i = chart;
  chart_local = (Chart *)this;
  cost = (float)Array<unsigned_int>::size(&chart->faces);
  CostQueue::clear(&this->m_bestTriangles);
  for (leastCentral = 0; chart_00 = _i, leastCentral < (uint)cost; leastCentral = leastCentral + 1)
  {
    puVar3 = Array<unsigned_int>::operator[](&_i->faces,leastCentral);
    cost_00 = evaluateProxyFitMetric(this,chart_00,*puVar3);
    maxDistance = cost_00;
    puVar3 = Array<unsigned_int>::operator[](&_i->faces,leastCentral);
    CostQueue::push(&this->m_bestTriangles,cost_00,*puVar3);
  }
  face = 0;
  local_34 = -1.0;
  while (uVar2 = CostQueue::count(&this->m_bestTriangles), uVar2 != 0) {
    faceCentroid.z = (float)CostQueue::pop(&this->m_bestTriangles);
    VVar4 = Mesh::computeFaceCenter(this->m_mesh,(uint32_t)faceCentroid.z);
    local_50 = VVar4.z;
    faceCentroid.x = local_50;
    _fStack_58 = VVar4._0_8_;
    local_48._0_4_ = fStack_58;
    local_48._4_4_ = distance;
    _fStack_58 = VVar4;
    VVar4 = operator-(&_i->centroid,(Vector3 *)local_48);
    _last = VVar4._0_8_;
    local_68.x = (float)last;
    local_68.y = (float)i_1;
    local_70 = VVar4.z;
    local_68.z = local_70;
    local_5c = internal::length(&local_68);
    if (local_34 < local_5c) {
      face = (uint32_t)faceCentroid.z;
      local_34 = local_5c;
    }
  }
  if (local_34 < 0.0) {
    __assert_fail("maxDistance >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x151c,"bool xatlas::internal::segment::Atlas::relocateSeed(Chart *)");
  }
  local_7c = 0;
  while( true ) {
    uVar2 = Array<unsigned_int>::size(&_i->seeds);
    if (uVar2 <= local_7c) {
      Array<unsigned_int>::push_back(&_i->seeds,&face);
      return true;
    }
    puVar3 = Array<unsigned_int>::operator[](&_i->seeds,local_7c);
    if (*puVar3 == face) break;
    puVar3 = Array<unsigned_int>::operator[](&_i->seeds,local_7c);
    puVar3 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,*puVar3);
    uVar1 = *puVar3;
    puVar3 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,face);
    if (uVar1 == *puVar3) break;
    local_7c = local_7c + 1;
  }
  uVar2 = Array<unsigned_int>::size(&_i->seeds);
  puVar3 = Array<unsigned_int>::operator[](&_i->seeds,local_7c);
  b = Array<unsigned_int>::operator[](&_i->seeds,uVar2 - 1);
  swap<unsigned_int>(puVar3,b);
  return false;
}

Assistant:

bool relocateSeed(Chart *chart)
	{
		// Find the first N triangles that fit the proxy best.
		const uint32_t faceCount = chart->faces.size();
		m_bestTriangles.clear();
		for (uint32_t i = 0; i < faceCount; i++) {
			const float cost = evaluateProxyFitMetric(chart, chart->faces[i]);
			m_bestTriangles.push(cost, chart->faces[i]);
		}
		// Of those, choose the least central triangle.
		uint32_t leastCentral = 0;
		float maxDistance = -1;
		for (;;) {
			if (m_bestTriangles.count() == 0)
				break;
			const uint32_t face = m_bestTriangles.pop();
			Vector3 faceCentroid = m_mesh->computeFaceCenter(face);
			const float distance = length(chart->centroid - faceCentroid);
			if (distance > maxDistance) {
				maxDistance = distance;
				leastCentral = face;
			}
		}
		XA_DEBUG_ASSERT(maxDistance >= 0);
		// In order to prevent k-means cyles we record all the previously chosen seeds.
		for (uint32_t i = 0; i < chart->seeds.size(); i++) {
			// Treat seeds belong to the same planar region as equal.
			if (chart->seeds[i] == leastCentral || m_facePlanarRegionId[chart->seeds[i]] == m_facePlanarRegionId[leastCentral]) {
				// Move new seed to the end of the seed array.
				uint32_t last = chart->seeds.size() - 1;
				swap(chart->seeds[i], chart->seeds[last]);
				return false;
			}
		}
		// Append new seed.
		chart->seeds.push_back(leastCentral);
		return true;
	}